

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lu_file.c
# Opt level: O2

void lu_file_empty(lu_int nlines,lu_int *begin,lu_int *end,lu_int *next,lu_int *prev,lu_int fmem)

{
  int iVar1;
  ulong uVar2;
  ulong uVar3;
  
  begin[nlines] = 0;
  end[nlines] = fmem;
  uVar3 = 0;
  uVar2 = 0;
  if (0 < nlines) {
    uVar2 = (ulong)(uint)nlines;
  }
  for (; uVar2 != uVar3; uVar3 = uVar3 + 1) {
    end[uVar3] = 0;
    begin[uVar3] = 0;
  }
  uVar3 = 0;
  while (uVar2 != uVar3) {
    iVar1 = (int)(uVar3 + 1);
    next[uVar3] = iVar1;
    prev[uVar3 + 1] = iVar1 + -1;
    uVar3 = uVar3 + 1;
  }
  next[nlines] = 0;
  *prev = nlines;
  return;
}

Assistant:

void lu_file_empty(
    lu_int nlines, lu_int *begin, lu_int *end, lu_int *next, lu_int *prev,
    lu_int fmem)
{
    lu_int i;

    begin[nlines] = 0;
    end[nlines] = fmem;
    for (i = 0; i < nlines; i++)
        begin[i] = end[i] = 0;
    for (i = 0; i < nlines; i++)
    {
        next[i] = i+1;
        prev[i+1] = i;
    }
    next[nlines] = 0;
    prev[0] = nlines;
}